

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Exporter.cpp
# Opt level: O2

void __thiscall Assimp::Exporter::SetProgressHandler(Exporter *this,ProgressHandler *pHandler)

{
  ProgressHandler *pPVar1;
  ExporterPimpl *pEVar2;
  bool bVar3;
  
  pEVar2 = this->pimpl;
  if (pEVar2 == (ExporterPimpl *)0x0) {
    __assert_fail("nullptr != pimpl",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/quantumsheep[P]unicy/libs/assimp/code/Common/Exporter.cpp"
                  ,0x114,"void Assimp::Exporter::SetProgressHandler(ProgressHandler *)");
  }
  if (pHandler == (ProgressHandler *)0x0) {
    pHandler = (ProgressHandler *)Intern::AllocateFromAssimpHeap::operator_new(8);
    pHandler->_vptr_ProgressHandler = (_func_int **)&PTR__ProgressHandler_00757f70;
    pEVar2 = this->pimpl;
    bVar3 = true;
  }
  else {
    pPVar1 = pEVar2->mProgressHandler;
    if (pPVar1 == pHandler) {
      return;
    }
    if (pPVar1 != (ProgressHandler *)0x0) {
      (*pPVar1->_vptr_ProgressHandler[1])();
      pEVar2 = this->pimpl;
    }
    bVar3 = false;
  }
  pEVar2->mProgressHandler = pHandler;
  this->pimpl->mIsDefaultProgressHandler = bVar3;
  return;
}

Assistant:

void Exporter::SetProgressHandler(ProgressHandler* pHandler) {
    ai_assert(nullptr != pimpl);

    if ( nullptr == pHandler) {
        // Release pointer in the possession of the caller
        pimpl->mProgressHandler = new DefaultProgressHandler();
        pimpl->mIsDefaultProgressHandler = true;
        return;
    }

    if (pimpl->mProgressHandler == pHandler) {
        return;
    }

    delete pimpl->mProgressHandler;
    pimpl->mProgressHandler = pHandler;
    pimpl->mIsDefaultProgressHandler = false;
}